

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadraticLikeCost.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::QuadraticLikeCost::costEvaluation
          (QuadraticLikeCost *this,double time,VectorDynSize *state,VectorDynSize *control,
          double *costValue)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  PointerType pdVar9;
  PointerType pdVar10;
  VectorDynSize *pVVar11;
  plainobjectbase_evaluator_data<double,_0> pVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar13;
  QuadraticLikeCost *pQVar14;
  bool isValid;
  ostringstream errorMsg;
  char local_21a;
  scalar_sum_op<double,_double> local_219;
  double local_218;
  PointerType local_210;
  QuadraticLikeCost *local_208;
  undefined1 local_200 [16];
  double *local_1f0;
  PointerType local_1e8;
  variable_if_dynamic<long,__1> local_1e0;
  variable_if_dynamic<long,__1> local_1d0;
  double *local_1c8;
  Scalar local_1c0;
  VectorDynSize *local_1b8;
  undefined1 local_1b0 [56];
  PointerType local_178;
  variable_if_dynamic<long,__1> local_170;
  ios_base local_140 [264];
  double *local_38;
  
  local_21a = '\0';
  peVar1 = (this->m_timeVaryingStateHessian).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_218 = time;
  local_38 = costValue;
  if (peVar1 == (element_type *)0x0) {
    local_210 = (PointerType)0x0;
LAB_00162d46:
    peVar2 = (this->m_timeVaryingStateGradient).
             super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      local_21a = '\0';
      (*peVar2->_vptr_TimeVaryingObject[2])(local_218,peVar2,&local_21a);
      if (local_21a == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,"Unable to retrieve a valid state gradient at time: ",0x33);
        poVar13 = std::ostream::_M_insert<double>(local_218);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,".",1);
        std::__cxx11::stringbuf::str();
        iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_200._0_8_);
LAB_00162ef1:
        if ((VectorDynSize *)local_200._0_8_ != (VectorDynSize *)&local_1f0) {
          operator_delete((void *)local_200._0_8_,(long)local_1f0 + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        std::ios_base::~ios_base(local_140);
        bVar5 = false;
      }
      else {
        lVar7 = iDynTree::VectorDynSize::size();
        lVar8 = iDynTree::VectorDynSize::size();
        if (lVar7 != lVar8) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b0,"The gradient at time: ",0x16);
          poVar13 = std::ostream::_M_insert<double>(local_218);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13," have dimensions different from the state.",0x2a);
          std::__cxx11::stringbuf::str();
          iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_200._0_8_);
          goto LAB_00162ef1;
        }
        pVVar11 = (VectorDynSize *)iDynTree::VectorDynSize::data();
        pVar12.data = (double *)iDynTree::VectorDynSize::size();
        pdVar10 = (PointerType)iDynTree::VectorDynSize::data();
        local_1e0.m_value = iDynTree::VectorDynSize::size();
        local_1c8 = &local_1c0;
        local_200._0_8_ = pVVar11;
        local_200._8_8_ = pVar12.data;
        local_1e8 = pdVar10;
        if ((PointerType)local_1e0.m_value == (PointerType)0x0) {
          local_1c0 = 0.0;
        }
        else {
          local_1b0._8_8_ = pVVar11;
          local_1b0._24_8_ = pVar12.data;
          local_1b0._32_8_ = pdVar10;
          local_1b0._48_8_ = local_1e0.m_value;
          local_1c0 = Eigen::internal::
                      redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>const>const,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>const>>,3,0>
                      ::
                      run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>const>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const>>
                                ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                                  *)local_1b0,&local_219,
                                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                                  *)local_200);
        }
        local_210 = (PointerType)((double)local_210 + *local_1c8);
        bVar5 = true;
      }
      if (!bVar5) goto LAB_001636b7;
    }
    peVar3 = (this->m_timeVaryingStateCostBias).
             super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<double>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (peVar3 != (element_type *)0x0) {
      local_21a = '\0';
      iVar6 = (*peVar3->_vptr_TimeVaryingObject[2])(local_218,peVar3,&local_21a);
      cVar4 = local_21a;
      if (local_21a == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,"Unable to retrieve a valid state cost bias at time: ",0x34)
        ;
        poVar13 = std::ostream::_M_insert<double>(local_218);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,".",1);
        std::__cxx11::stringbuf::str();
        iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_200._0_8_);
        if ((VectorDynSize *)local_200._0_8_ != (VectorDynSize *)&local_1f0) {
          operator_delete((void *)local_200._0_8_,(long)local_1f0 + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        std::ios_base::~ios_base(local_140);
      }
      else {
        local_210 = (PointerType)((double)local_210 + *(double *)CONCAT44(extraout_var,iVar6));
      }
      if (cVar4 == '\0') goto LAB_001636b7;
    }
    peVar1 = (this->m_timeVaryingControlHessian).
             super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      local_208 = (QuadraticLikeCost *)0x0;
    }
    else {
      local_21a = '\0';
      (*peVar1->_vptr_TimeVaryingObject[2])(local_218,peVar1,&local_21a);
      if (local_21a == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,"Unable to retrieve a valid control hessian at time: ",0x34)
        ;
        poVar13 = std::ostream::_M_insert<double>(local_218);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,".",1);
        std::__cxx11::stringbuf::str();
        iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_200._0_8_);
LAB_00163344:
        if ((VectorDynSize *)local_200._0_8_ != (VectorDynSize *)&local_1f0) {
          operator_delete((void *)local_200._0_8_,(long)local_1f0 + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        std::ios_base::~ios_base(local_140);
        local_208 = (QuadraticLikeCost *)0x0;
        bVar5 = false;
      }
      else {
        lVar7 = iDynTree::MatrixDynSize::rows();
        lVar8 = iDynTree::MatrixDynSize::cols();
        if (lVar7 != lVar8) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b0,"The control hessian at time: ",0x1d);
          poVar13 = std::ostream::_M_insert<double>(local_218);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13," is not squared.",0x10);
          std::__cxx11::stringbuf::str();
          iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_200._0_8_);
          goto LAB_00163344;
        }
        lVar7 = iDynTree::MatrixDynSize::rows();
        lVar8 = iDynTree::VectorDynSize::size();
        if (lVar7 != lVar8) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b0,"The hessian at time: ",0x15);
          poVar13 = std::ostream::_M_insert<double>(local_218);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13," does not match the control dimension.",0x26);
          std::__cxx11::stringbuf::str();
          iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_200._0_8_);
          goto LAB_00163344;
        }
        local_208 = (QuadraticLikeCost *)iDynTree::VectorDynSize::data();
        pVVar11 = (VectorDynSize *)iDynTree::VectorDynSize::size();
        pdVar9 = (PointerType)iDynTree::MatrixDynSize::data();
        lVar7 = iDynTree::MatrixDynSize::rows();
        lVar8 = iDynTree::MatrixDynSize::cols();
        pdVar10 = (PointerType)iDynTree::VectorDynSize::data();
        local_1b8 = control;
        local_170.m_value = iDynTree::VectorDynSize::size();
        local_1c8 = &local_1c0;
        local_1b0._0_8_ = local_208;
        pQVar14 = (QuadraticLikeCost *)0.0;
        local_1b0._8_8_ = pVVar11;
        local_1b0._24_8_ = pdVar9;
        local_1b0._32_8_ = lVar7;
        local_1b0._40_8_ = lVar8;
        local_178 = pdVar10;
        if (local_170.m_value != 0) {
          Eigen::internal::
          product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          ::product_evaluator((product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                               *)(local_200 + 8),(XprType *)local_1b0);
          local_1e0.m_value = (long)local_178;
          local_1d0.m_value = local_170.m_value;
          local_208 = (QuadraticLikeCost *)
                      Eigen::internal::
                      redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>,Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::Stride<0,0>>,0>const>const,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>const>>,3,0>
                      ::
                      run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>,0>const>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const>>
                                ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                                  *)local_200,&local_219,
                                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                                  *)local_1b0);
          free(local_1f0);
          pQVar14 = local_208;
        }
        local_208 = (QuadraticLikeCost *)(*local_1c8 * 0.5 + 0.0);
        bVar5 = true;
        local_1c0 = (Scalar)pQVar14;
      }
      if (!bVar5) goto LAB_001636b7;
    }
    peVar2 = (this->m_timeVaryingControlGradient).
             super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      local_21a = '\0';
      (*peVar2->_vptr_TimeVaryingObject[2])(local_218,peVar2,&local_21a);
      if (local_21a == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,"Unable to retrieve a valid control gradient at time: ",0x35
                  );
        poVar13 = std::ostream::_M_insert<double>(local_218);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,".",1);
        std::__cxx11::stringbuf::str();
        iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_200._0_8_);
LAB_00163539:
        if ((VectorDynSize *)local_200._0_8_ != (VectorDynSize *)&local_1f0) {
          operator_delete((void *)local_200._0_8_,(long)local_1f0 + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        std::ios_base::~ios_base(local_140);
        bVar5 = false;
      }
      else {
        lVar7 = iDynTree::VectorDynSize::size();
        lVar8 = iDynTree::VectorDynSize::size();
        if (lVar7 != lVar8) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b0,"The control hessian at time ",0x1c);
          poVar13 = std::ostream::_M_insert<double>(local_218);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13," have dimension different from the control dimension.",0x35);
          std::__cxx11::stringbuf::str();
          iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_200._0_8_);
          goto LAB_00163539;
        }
        pVVar11 = (VectorDynSize *)iDynTree::VectorDynSize::data();
        pVar12.data = (double *)iDynTree::VectorDynSize::size();
        pdVar10 = (PointerType)iDynTree::VectorDynSize::data();
        local_1e0.m_value = iDynTree::VectorDynSize::size();
        local_1c8 = &local_1c0;
        local_200._0_8_ = pVVar11;
        local_200._8_8_ = pVar12.data;
        local_1e8 = pdVar10;
        if ((PointerType)local_1e0.m_value == (PointerType)0x0) {
          local_1c0 = 0.0;
        }
        else {
          local_1b0._8_8_ = pVVar11;
          local_1b0._24_8_ = pVar12.data;
          local_1b0._32_8_ = pdVar10;
          local_1b0._48_8_ = local_1e0.m_value;
          local_1c0 = Eigen::internal::
                      redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>const>const,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>const>>,3,0>
                      ::
                      run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>const>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const>>
                                ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                                  *)local_1b0,&local_219,
                                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                                  *)local_200);
        }
        local_208 = (QuadraticLikeCost *)((double)local_208 + *local_1c8);
        bVar5 = true;
      }
      if (!bVar5) goto LAB_001636b7;
    }
    peVar3 = (this->m_timeVaryingControlCostBias).
             super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<double>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (peVar3 != (element_type *)0x0) {
      local_21a = '\0';
      iVar6 = (*peVar3->_vptr_TimeVaryingObject[2])(local_218,peVar3,&local_21a);
      cVar4 = local_21a;
      if (local_21a == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,"Unable to retrieve a valid control cost bias at time: ",
                   0x36);
        poVar13 = std::ostream::_M_insert<double>(local_218);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,".",1);
        std::__cxx11::stringbuf::str();
        iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_200._0_8_);
        if ((VectorDynSize *)local_200._0_8_ != (VectorDynSize *)&local_1f0) {
          operator_delete((void *)local_200._0_8_,(long)local_1f0 + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        std::ios_base::~ios_base(local_140);
      }
      else {
        local_208 = (QuadraticLikeCost *)
                    ((double)local_208 + *(double *)CONCAT44(extraout_var_00,iVar6));
      }
      if (cVar4 == '\0') goto LAB_001636b7;
    }
    *local_38 = (double)local_210 + (double)local_208;
    bVar5 = true;
  }
  else {
    (*peVar1->_vptr_TimeVaryingObject[2])(time,peVar1,&local_21a);
    if (local_21a == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"Unable to retrieve a valid state hessian at time: ",0x32);
      poVar13 = std::ostream::_M_insert<double>(local_218);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,".",1);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_200._0_8_);
LAB_00162cf3:
      if ((VectorDynSize *)local_200._0_8_ != (VectorDynSize *)&local_1f0) {
        operator_delete((void *)local_200._0_8_,(long)local_1f0 + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
      std::ios_base::~ios_base(local_140);
      local_210 = (PointerType)0x0;
      bVar5 = false;
    }
    else {
      lVar7 = iDynTree::MatrixDynSize::rows();
      lVar8 = iDynTree::MatrixDynSize::cols();
      if (lVar7 != lVar8) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,"The state hessian at time: ",0x1b);
        poVar13 = std::ostream::_M_insert<double>(local_218);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," is not squared.",0x10);
        std::__cxx11::stringbuf::str();
        iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_200._0_8_);
        goto LAB_00162cf3;
      }
      lVar7 = iDynTree::MatrixDynSize::rows();
      lVar8 = iDynTree::VectorDynSize::size();
      if (lVar7 != lVar8) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,"The hessian at time: ",0x15);
        poVar13 = std::ostream::_M_insert<double>(local_218);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13," does not match the state dimension.",0x24);
        std::__cxx11::stringbuf::str();
        iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_200._0_8_);
        goto LAB_00162cf3;
      }
      local_210 = (PointerType)iDynTree::VectorDynSize::data();
      local_1b8 = (VectorDynSize *)iDynTree::VectorDynSize::size();
      pdVar9 = (PointerType)iDynTree::MatrixDynSize::data();
      local_208 = this;
      lVar7 = iDynTree::MatrixDynSize::rows();
      lVar8 = iDynTree::MatrixDynSize::cols();
      pdVar10 = (PointerType)iDynTree::VectorDynSize::data();
      local_170.m_value = iDynTree::VectorDynSize::size();
      this = local_208;
      local_1c8 = &local_1c0;
      local_1b0._0_8_ = local_210;
      local_1b0._8_8_ = local_1b8;
      local_1c0 = 0.0;
      local_1b0._24_8_ = pdVar9;
      local_1b0._32_8_ = lVar7;
      local_1b0._40_8_ = lVar8;
      local_178 = pdVar10;
      if (local_170.m_value != 0) {
        Eigen::internal::
        product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        ::product_evaluator((product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                             *)(local_200 + 8),(XprType *)local_1b0);
        local_1e0.m_value = (long)local_178;
        local_1d0.m_value = local_170.m_value;
        local_210 = (PointerType)
                    Eigen::internal::
                    redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>,Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::Stride<0,0>>,0>const>const,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>const>>,3,0>
                    ::
                    run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Product<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>,0>const>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const>>
                              ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                                *)local_200,&local_219,
                               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                                *)local_1b0);
        free(local_1f0);
        local_1c0 = (Scalar)local_210;
      }
      local_210 = (PointerType)(*local_1c8 * 0.5 + 0.0);
      bVar5 = true;
    }
    if (bVar5) goto LAB_00162d46;
LAB_001636b7:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool QuadraticLikeCost::costEvaluation(double time,
                                           const iDynTree::VectorDynSize& state,
                                           const iDynTree::VectorDynSize& control,
                                           double& costValue)
        {
            double stateCost = 0, controlCost = 0;

            bool isValid = false;
            if (m_timeVaryingStateHessian) {
                const MatrixDynSize &hessian = m_timeVaryingStateHessian->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid state hessian at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != hessian.cols()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The state hessian at time: " << time << " is not squared.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != state.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The hessian at time: " << time << " does not match the state dimension.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }
                stateCost += 0.5 * (toEigen(state).transpose() * toEigen(hessian) * toEigen(state))(0);
            }

            if (m_timeVaryingStateGradient) {

                isValid = false;
                const VectorDynSize &gradient = m_timeVaryingStateGradient->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid state gradient at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (state.size() != gradient.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The gradient at time: " << time << " have dimensions different from the state.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }
                stateCost += toEigen(gradient).transpose()*toEigen(state);
            }

            if (m_timeVaryingStateCostBias) {

                isValid = false;
                double stateBias = m_timeVaryingStateCostBias->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid state cost bias at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                stateCost += stateBias;
            }

            if (m_timeVaryingControlHessian) {

                isValid = false;
                const MatrixDynSize &hessian = m_timeVaryingControlHessian->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid control hessian at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != hessian.cols()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The control hessian at time: " << time << " is not squared.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != control.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The hessian at time: " << time << " does not match the control dimension.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                controlCost += 0.5 * (toEigen(control).transpose() * toEigen(hessian) * toEigen(control))(0);
            }

            if (m_timeVaryingControlGradient) {

                isValid = false;
                const VectorDynSize &gradient = m_timeVaryingControlGradient->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid control gradient at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (control.size() != gradient.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The control hessian at time " << time << " have dimension different from the control dimension.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }
                controlCost += toEigen(gradient).transpose()*toEigen(control);
            }

            if (m_timeVaryingControlCostBias) {

                isValid = false;
                double controlBias = m_timeVaryingControlCostBias->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid control cost bias at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                controlCost += controlBias;
            }

            costValue = stateCost + controlCost;
            return true;
        }